

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

undefined8 __thiscall project::get_source_groups_abi_cxx11_(project *this)

{
  const_iterator pxVar1;
  bool bVar2;
  const_iterator pxVar3;
  ostream *poVar4;
  char_t *pcVar5;
  xml_node query;
  xml_attribute variables;
  ostream *poVar6;
  undefined8 in_RDI;
  xpath_node node_2;
  const_iterator it_2;
  xpath_node_set sub_source;
  stringstream q;
  xpath_node node_1;
  const_iterator it_1;
  xpath_node_set source_groups;
  xpath_node node;
  const_iterator it;
  xpath_node_set sources;
  stringstream ss;
  xpath_node *in_stack_fffffffffffffa88;
  xml_attribute in_stack_fffffffffffffa90;
  xml_node in_stack_fffffffffffffa98;
  xml_attribute *in_stack_fffffffffffffaa0;
  xpath_variable_set *in_stack_fffffffffffffad8;
  char_t *in_stack_fffffffffffffae0;
  xml_node *in_stack_fffffffffffffae8;
  xml_attribute local_460;
  xml_node_struct *local_458;
  xml_attribute_struct *pxStack_450;
  const_iterator local_440;
  string local_438 [32];
  xpath_node_set local_418;
  xml_node_struct *local_3f0;
  xml_attribute local_3e8;
  stringstream local_3e0 [16];
  ostream local_3d0 [376];
  xml_node_struct *local_258;
  xml_attribute local_250;
  xml_node_struct *local_248;
  xml_attribute_struct *pxStack_240;
  const_iterator local_238;
  xpath_node_set local_230;
  xml_node_struct *local_208;
  xml_attribute local_200;
  xml_node_struct *local_1f8;
  xml_attribute_struct *local_1f0;
  xml_node_struct *local_1e8;
  xml_attribute_struct *pxStack_1e0;
  const_iterator local_1d8;
  xpath_node_set local_1c0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  pugi::xml_node::select_nodes
            (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  std::operator<<(local_188,"\nsource_group (Source FILES\n");
  for (local_1d8 = pugi::xpath_node_set::begin(&local_1c0); pxVar1 = local_1d8,
      pxVar3 = pugi::xpath_node_set::end(&local_1c0), pxVar1 != pxVar3; local_1d8 = local_1d8 + 1) {
    local_1e8 = (local_1d8->_node)._root;
    pxStack_1e0 = (local_1d8->_attribute)._attr;
    local_1f8 = (xml_node_struct *)pugi::xpath_node::node(in_stack_fffffffffffffa88);
    local_1f0 = (xml_attribute_struct *)
                pugi::xml_node::attribute
                          ((xml_node *)in_stack_fffffffffffffa98._root,
                           in_stack_fffffffffffffa90._attr);
    bVar2 = pugi::xml_attribute::as_bool
                      (in_stack_fffffffffffffaa0,
                       SUB81((ulong)in_stack_fffffffffffffa98._root >> 0x38,0));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<(local_188,"\n    ");
      local_208 = (xml_node_struct *)pugi::xpath_node::node(in_stack_fffffffffffffa88);
      local_200 = pugi::xml_node::attribute
                            ((xml_node *)in_stack_fffffffffffffa98._root,
                             in_stack_fffffffffffffa90._attr);
      pcVar5 = pugi::xml_attribute::value(&local_200);
      std::operator<<(poVar4,pcVar5);
    }
  }
  std::operator<<(local_188,"\n");
  std::operator<<(local_188,")\n");
  pugi::xml_node::select_nodes
            (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  for (local_238 = pugi::xpath_node_set::begin(&local_230); pxVar1 = local_238,
      pxVar3 = pugi::xpath_node_set::end(&local_230), pxVar1 != pxVar3; local_238 = local_238 + 1) {
    local_248 = (local_238->_node)._root;
    pxStack_240 = (local_238->_attribute)._attr;
    poVar4 = std::operator<<(local_188,"\nsource_group (Source\\\\");
    local_258 = (xml_node_struct *)pugi::xpath_node::node(in_stack_fffffffffffffa88);
    local_250 = pugi::xml_node::attribute
                          ((xml_node *)in_stack_fffffffffffffa98._root,
                           in_stack_fffffffffffffa90._attr);
    pcVar5 = pugi::xml_attribute::value(&local_250);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4," FILES\n");
    std::__cxx11::stringstream::stringstream(local_3e0);
    poVar4 = std::operator<<(local_3d0,"/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = \'");
    query = pugi::xpath_node::node(in_stack_fffffffffffffa88);
    local_3f0 = query._root;
    variables = pugi::xml_node::attribute
                          ((xml_node *)in_stack_fffffffffffffa98._root,
                           in_stack_fffffffffffffa90._attr);
    local_3e8 = variables;
    pcVar5 = pugi::xml_attribute::value(&local_3e8);
    poVar6 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar6,"\']/FILE");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    pugi::xml_node::select_nodes
              ((xml_node *)poVar4,(char_t *)query._root,(xpath_variable_set *)variables._attr);
    std::__cxx11::string::~string(local_438);
    for (local_440 = pugi::xpath_node_set::begin(&local_418); pxVar1 = local_440,
        pxVar3 = pugi::xpath_node_set::end(&local_418), pxVar1 != pxVar3; local_440 = local_440 + 1)
    {
      local_458 = (local_440->_node)._root;
      pxStack_450 = (local_440->_attribute)._attr;
      poVar4 = std::operator<<(local_188,"\n    ");
      in_stack_fffffffffffffa98 = pugi::xpath_node::node(in_stack_fffffffffffffa88);
      in_stack_fffffffffffffa90 =
           pugi::xml_node::attribute
                     ((xml_node *)in_stack_fffffffffffffa98._root,in_stack_fffffffffffffa90._attr);
      local_460 = in_stack_fffffffffffffa90;
      in_stack_fffffffffffffa88 = (xpath_node *)pugi::xml_attribute::value(&local_460);
      std::operator<<(poVar4,(char *)in_stack_fffffffffffffa88);
    }
    std::operator<<(local_188,"\n)\n");
    pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)in_stack_fffffffffffffa90._attr);
    std::__cxx11::stringstream::~stringstream(local_3e0);
  }
  std::operator<<(local_188,"\n");
  std::__cxx11::stringstream::str();
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)in_stack_fffffffffffffa90._attr);
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)in_stack_fffffffffffffa90._attr);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string project::get_source_groups()
{
    std::stringstream ss;

    pugi::xpath_node_set sources = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/FILE");
    ss << "\nsource_group (Source FILES\n";
    for (pugi::xpath_node_set::const_iterator it = sources.begin(); it != sources.end(); ++it)
    {
        pugi::xpath_node node = *it;
        if(!node.node().attribute("resource").as_bool()) {
            ss << "\n    " << node.node().attribute("file").value();
        }
    }
    ss << "\n";
    ss << ")\n";

    pugi::xpath_node_set source_groups = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/GROUP");
    for (pugi::xpath_node_set::const_iterator it = source_groups.begin(); it != source_groups.end(); ++it)
    {
        pugi::xpath_node node = *it;
        ss << "\nsource_group (Source\\\\" << node.node().attribute("name").value() << " FILES\n";

        std::stringstream q;
        q << "/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = '" << node.node().attribute("name").value() << "']/FILE";
        pugi::xpath_node_set sub_source = m_Doc.select_nodes(q.str().c_str());
        for (pugi::xpath_node_set::const_iterator it = sub_source.begin(); it != sub_source.end(); ++it)
        {
            pugi::xpath_node node = *it;
            ss << "\n    " << node.node().attribute("file").value();
        }
        ss << "\n)\n";
    }
    ss << "\n";

    return ss.str();
}